

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::GetAnimationFileList
          (SMDImporter *this,string *pFile,IOSystem *pIOHandler,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outList)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar6;
  char *__s;
  size_type *psVar7;
  long *plVar8;
  string animName;
  string animPath;
  vector<char,_std::allocator<char>_> buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  string base;
  char *context2;
  char *context1;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  vector<char,_std::allocator<char>_> local_148;
  IOStream *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  long *local_e8;
  long local_d8 [2];
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8 [2];
  long local_98 [2];
  string local_88;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
  *local_68;
  char *local_60;
  char *local_58;
  string local_50;
  IOStream *pIVar5;
  
  local_68 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
              *)outList;
  DefaultIOSystem::absolutePath(&local_88,pFile);
  DefaultIOSystem::completeBaseName(&local_50,pFile);
  paVar1 = &local_188.field_2;
  local_188._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  std::__cxx11::string::append((char *)&local_188);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_188,(ulong)local_50._M_dataplus._M_p);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_108.field_2._M_allocated_capacity = *psVar7;
    local_108.field_2._8_8_ = plVar4[3];
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar7;
    local_108._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_108._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
  local_c8 = &local_b8;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_b8 = *plVar8;
    lStack_b0 = plVar4[3];
  }
  else {
    local_b8 = *plVar8;
    local_c8 = (long *)*plVar4;
  }
  local_c0 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p,
                    CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                             local_188.field_2._M_local_buf[0]) + 1);
  }
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_c8,"rb");
  pIVar5 = (IOStream *)CONCAT44(extraout_var,iVar3);
  if (pIVar5 != (IOStream *)0x0) {
    local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_130 = pIVar5;
    iVar3 = (*pIVar5->_vptr_IOStream[6])(pIVar5);
    std::vector<char,_std::allocator<char>_>::resize(&local_148,CONCAT44(extraout_var_00,iVar3) + 1)
    ;
    BaseImporter::TextFileToBuffer(pIVar5,&local_148,FORBID_EMPTY);
    local_188._M_string_length = 0;
    local_188.field_2._M_local_buf[0] = '\0';
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    local_168._M_string_length = 0;
    local_168.field_2._M_local_buf[0] = '\0';
    local_188._M_dataplus._M_p = (pointer)paVar1;
    pcVar6 = strtok_r(local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,"\r\n",&local_58);
    if (pcVar6 != (char *)0x0) {
      do {
        pcVar6 = strtok_r(pcVar6," \t",&local_60);
        if (pcVar6 != (char *)0x0) {
          __s = strtok_r((char *)0x0," \t",&local_60);
          sVar2 = local_168._M_string_length;
          if (__s == (char *)0x0) {
            strlen(pcVar6);
            std::__cxx11::string::_M_replace((ulong)&local_168,0,(char *)sVar2,(ulong)pcVar6);
            DefaultIOSystem::completeBaseName(&local_108,&local_168);
            std::__cxx11::string::operator=((string *)&local_188,(string *)&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)&local_168,0,(char *)sVar2,(ulong)__s);
            sVar2 = local_188._M_string_length;
            strlen(pcVar6);
            std::__cxx11::string::_M_replace((ulong)&local_188,0,(char *)sVar2,(ulong)pcVar6);
          }
          local_a8[0] = local_98;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a8,local_88._M_dataplus._M_p,
                     local_88._M_dataplus._M_p + local_88._M_string_length);
          std::__cxx11::string::append((char *)local_a8);
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_a8,(ulong)local_168._M_dataplus._M_p);
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_128.field_2._M_allocated_capacity = *psVar7;
            local_128.field_2._8_8_ = plVar4[3];
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar7;
            local_128._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_128._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
          _Tuple_impl<std::__cxx11::string&,std::__cxx11::string,void>
                    ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&local_108,
                     &local_188,&local_128);
          std::
          vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::tuple<std::__cxx11::string,std::__cxx11::string>>
                    (local_68,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_108);
          if (local_e8 != local_d8) {
            operator_delete(local_e8,local_d8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (local_a8[0] != local_98) {
            operator_delete(local_a8[0],local_98[0] + 1);
          }
        }
        pcVar6 = strtok_r((char *)0x0,"\r\n",&local_58);
      } while (pcVar6 != (char *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,
                      CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                               local_168.field_2._M_local_buf[0]) + 1);
    }
    pIVar5 = local_130;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,
                      CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                               local_188.field_2._M_local_buf[0]) + 1);
    }
    if (local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (pIVar5 != (IOStream *)0x0) {
      (*pIVar5->_vptr_IOStream[1])(pIVar5);
    }
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SMDImporter::GetAnimationFileList(const std::string &pFile, IOSystem* pIOHandler, std::vector<std::tuple<std::string, std::string>>& outList) {
    auto base = DefaultIOSystem::absolutePath(pFile);
    auto name = DefaultIOSystem::completeBaseName(pFile);
    auto path = base + "/" + name + "_animation.txt";

    std::unique_ptr<IOStream> file(pIOHandler->Open(path.c_str(), "rb"));
    if (file.get() == nullptr) {
        return;
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> buf;
    size_t fileSize = file->FileSize();
    buf.resize(fileSize + 1);
    TextFileToBuffer(file.get(), buf);

    /*
        *_animation.txt format:
        name path
        idle idle.smd
        jump anim/jump.smd
        walk.smd
        ...
    */
    std::string animName, animPath;
    char *tok1, *tok2;
    char *context1, *context2;

    tok1 = strtok_s(&buf[0], "\r\n", &context1);
    while (tok1 != NULL) {
        tok2 = strtok_s(tok1, " \t", &context2);
        if (tok2) {
            char *p = tok2;
            tok2 = strtok_s(nullptr, " \t", &context2);
            if (tok2) {
                animPath = tok2;
                animName = p;
            } else  {
                // No name
                animPath = p;
                animName = DefaultIOSystem::completeBaseName(animPath);
            }
            outList.push_back(std::make_tuple(animName, base + "/" + animPath));
        }
        tok1 = strtok_s(nullptr, "\r\n", &context1);
    }
}